

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.h
# Opt level: O1

void google::protobuf::compiler::java::
     MaybePrintGeneratedAnnotation<google::protobuf::ServiceDescriptor_const>
               (Context *context,Printer *printer,ServiceDescriptor *descriptor,bool immutable,
               string *suffix)

{
  string local_30;
  
  if (((context->options_).annotate_code == true) &&
     (*(char *)(*(long *)(*(long *)(descriptor + 0x10) + 0xa0) + 0xa0) == '\x01')) {
    AnnotationFileName<google::protobuf::ServiceDescriptor>(&local_30,descriptor,suffix);
    PrintGeneratedAnnotation(printer,'$',&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void MaybePrintGeneratedAnnotation(Context* context, io::Printer* printer,
                                   Descriptor* descriptor, bool immutable,
                                   const string& suffix = "") {
  if (context->options().annotate_code && IsOwnFile(descriptor, immutable)) {
    PrintGeneratedAnnotation(printer, '$',
                             AnnotationFileName(descriptor, suffix));
  }
}